

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

SrcList * sqlite3SrcListEnlarge(sqlite3 *db,SrcList *pSrc,int nExtra,int iStart)

{
  short sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  SrcList *pSVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  undefined4 *puVar10;
  long lVar11;
  ulong uVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar18 [16];
  
  bVar15 = 0;
  sVar1 = pSrc->nSrc;
  iVar8 = (int)sVar1;
  if ((int)pSrc->nAlloc < iVar8 + nExtra) {
    pSVar6 = (SrcList *)sqlite3DbRealloc(db,pSrc,(iVar8 + nExtra) * 0x68 + 8);
    if (pSVar6 == (SrcList *)0x0) {
      return pSrc;
    }
    if (((db == (sqlite3 *)0x0) || (pSVar6 < (SrcList *)(db->lookaside).pStart)) ||
       ((SrcList *)(db->lookaside).pEnd <= pSVar6)) {
      uVar5 = (*sqlite3Config.m.xSize)(pSVar6);
    }
    else {
      uVar5 = (uint)(db->lookaside).sz;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(int)uVar5 - 0x70;
    pSVar6->nAlloc = (short)(SUB164(auVar2 * ZEXT816(0x4ec4ec4ec4ec4ec5),8) >> 5) + 1;
    sVar1 = pSVar6->nSrc;
    iVar8 = (int)sVar1;
    pSrc = pSVar6;
  }
  if (iStart < iVar8) {
    lVar7 = (long)sVar1;
    lVar11 = lVar7 * 0x68 + -0x60;
    do {
      lVar7 = lVar7 + -1;
      puVar13 = (undefined8 *)((long)pSrc->a + lVar11 + -8);
      puVar14 = (undefined8 *)((long)pSrc->a + lVar11 + (long)nExtra * 0x68 + -8);
      for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar14 = *puVar13;
        puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
        puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
      }
      lVar11 = lVar11 + -0x68;
    } while (iStart < lVar7);
    sVar1 = pSrc->nSrc;
  }
  lVar7 = (long)iStart;
  pSrc->nSrc = sVar1 + (short)nExtra;
  memset(pSrc->a + lVar7,0,(ulong)(uint)nExtra * 0x68);
  auVar4 = _DAT_001aa8b0;
  auVar3 = _DAT_001aa8a0;
  auVar2 = _DAT_001aa890;
  if (0 < nExtra) {
    lVar11 = (long)(iStart + nExtra);
    if ((long)(iStart + nExtra) < lVar7 + 1) {
      lVar11 = lVar7 + 1;
    }
    lVar9 = (lVar11 - lVar7) + -1;
    auVar16._8_4_ = (int)lVar9;
    auVar16._0_8_ = lVar9;
    auVar16._12_4_ = (int)((ulong)lVar9 >> 0x20);
    puVar10 = (undefined4 *)((long)&pSrc[3].a[lVar7].pTab + 4);
    uVar12 = 0;
    auVar16 = auVar16 ^ _DAT_001aa8b0;
    do {
      auVar17._8_4_ = (int)uVar12;
      auVar17._0_8_ = uVar12;
      auVar17._12_4_ = (int)(uVar12 >> 0x20);
      auVar18 = (auVar17 | auVar3) ^ auVar4;
      iVar8 = auVar16._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar8 && auVar16._0_4_ < auVar18._0_4_ || iVar8 < auVar18._4_4_)
                & 1)) {
        puVar10[-0x4e] = 0xffffffff;
      }
      if ((auVar18._12_4_ != auVar16._12_4_ || auVar18._8_4_ <= auVar16._8_4_) &&
          auVar18._12_4_ <= auVar16._12_4_) {
        puVar10[-0x34] = 0xffffffff;
      }
      auVar17 = (auVar17 | auVar2) ^ auVar4;
      iVar19 = auVar17._4_4_;
      if (iVar19 <= iVar8 && (iVar19 != iVar8 || auVar17._0_4_ <= auVar16._0_4_)) {
        puVar10[-0x1a] = 0xffffffff;
        *puVar10 = 0xffffffff;
      }
      uVar12 = uVar12 + 4;
      puVar10 = puVar10 + 0x68;
    } while (((lVar11 - lVar7) + 3U & 0xfffffffffffffffc) != uVar12);
  }
  return pSrc;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListEnlarge(
  sqlite3 *db,       /* Database connection to notify of OOM errors */
  SrcList *pSrc,     /* The SrcList to be enlarged */
  int nExtra,        /* Number of new slots to add to pSrc->a[] */
  int iStart         /* Index in pSrc->a[] of first new slot */
){
  int i;

  /* Sanity checking on calling parameters */
  assert( iStart>=0 );
  assert( nExtra>=1 );
  assert( pSrc!=0 );
  assert( iStart<=pSrc->nSrc );

  /* Allocate additional space if needed */
  if( pSrc->nSrc+nExtra>pSrc->nAlloc ){
    SrcList *pNew;
    int nAlloc = pSrc->nSrc+nExtra;
    int nGot;
    pNew = sqlite3DbRealloc(db, pSrc,
               sizeof(*pSrc) + (nAlloc-1)*sizeof(pSrc->a[0]) );
    if( pNew==0 ){
      assert( db->mallocFailed );
      return pSrc;
    }
    pSrc = pNew;
    nGot = (sqlite3DbMallocSize(db, pNew) - sizeof(*pSrc))/sizeof(pSrc->a[0])+1;
    pSrc->nAlloc = (u16)nGot;
  }

  /* Move existing slots that come after the newly inserted slots
  ** out of the way */
  for(i=pSrc->nSrc-1; i>=iStart; i--){
    pSrc->a[i+nExtra] = pSrc->a[i];
  }
  pSrc->nSrc += (i16)nExtra;

  /* Zero the newly allocated slots */
  memset(&pSrc->a[iStart], 0, sizeof(pSrc->a[0])*nExtra);
  for(i=iStart; i<iStart+nExtra; i++){
    pSrc->a[i].iCursor = -1;
  }

  /* Return a pointer to the enlarged SrcList */
  return pSrc;
}